

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

void __thiscall
helics::MessageConditionalOperator::MessageConditionalOperator
          (MessageConditionalOperator *this,
          function<bool_(const_helics::Message_*)> *userConditionalFunction)

{
  function<bool_(const_helics::Message_*)> *in_RDI;
  function<bool_(const_helics::Message_*)> *in_stack_ffffffffffffffd8;
  
  FilterOperator::FilterOperator((FilterOperator *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor =
       &PTR__MessageConditionalOperator_00a4ef68;
  std::function<bool_(const_helics::Message_*)>::function(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

MessageConditionalOperator::MessageConditionalOperator(
    std::function<bool(const Message*)> userConditionalFunction):
    evalFunction(std::move(userConditionalFunction))
{
}